

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest.cc
# Opt level: O3

void gflags::anon_unknown_5::Test_GetCommandLineFlagInfoTest_FlagExists::Run(void)

{
  string *psVar1;
  string *psVar2;
  string *psVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  string *psVar5;
  bool bVar6;
  int iVar7;
  undefined8 extraout_RAX;
  FlagSaver fs;
  FlagSaver FStack_108;
  CommandLineFlagInfo local_100;
  
  FlagSaver::FlagSaver(&FStack_108);
  fprintf(_stderr,"Running test %s/%s\n","GetCommandLineFlagInfoTest","FlagExists");
  local_100.name._M_dataplus._M_p = (pointer)&local_100.name.field_2;
  local_100.name._M_string_length = 0;
  local_100.name.field_2._M_local_buf[0] = '\0';
  local_100.type._M_dataplus._M_p = (pointer)&local_100.type.field_2;
  local_100.type._M_string_length = 0;
  local_100.type.field_2._M_local_buf[0] = '\0';
  local_100.description._M_dataplus._M_p = (pointer)&local_100.description.field_2;
  local_100.description._M_string_length = 0;
  local_100.description.field_2._M_local_buf[0] = '\0';
  local_100.current_value._M_dataplus._M_p = (pointer)&local_100.current_value.field_2;
  local_100.current_value._M_string_length = 0;
  local_100.current_value.field_2._M_local_buf[0] = '\0';
  local_100.default_value._M_dataplus._M_p = (pointer)&local_100.default_value.field_2;
  local_100.default_value._M_string_length = 0;
  local_100.default_value.field_2._M_local_buf[0] = '\0';
  paVar4 = &local_100.filename.field_2;
  local_100.filename._M_string_length = 0;
  local_100.filename.field_2._M_local_buf[0] = '\0';
  local_100.filename._M_dataplus._M_p = (pointer)paVar4;
  bVar6 = GetCommandLineFlagInfo("test_int32",&local_100);
  if (bVar6) {
    iVar7 = std::__cxx11::string::compare((char *)&local_100);
    if (iVar7 != 0) goto LAB_001387a0;
    psVar1 = &local_100.type;
    iVar7 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar7 != 0) goto LAB_001387a5;
    psVar2 = &local_100.description;
    iVar7 = std::__cxx11::string::compare((char *)psVar2);
    if (iVar7 != 0) goto LAB_001387aa;
    psVar3 = &local_100.current_value;
    iVar7 = std::__cxx11::string::compare((char *)psVar3);
    if (iVar7 != 0) goto LAB_001387af;
    psVar5 = &local_100.default_value;
    iVar7 = std::__cxx11::string::compare((char *)psVar5);
    if (iVar7 != 0) goto LAB_001387b4;
    if (local_100.is_default == false) goto LAB_001387b9;
    if (local_100.has_validator_fn == true) goto LAB_001387be;
    if ((undefined4 *)local_100.flag_ptr != &fLI::FLAGS_test_int32) goto LAB_001387c3;
    fLB::FLAGS_test_bool = 1;
    bVar6 = GetCommandLineFlagInfo("test_bool",&local_100);
    if (!bVar6) goto LAB_001387c8;
    iVar7 = std::__cxx11::string::compare((char *)&local_100);
    if (iVar7 != 0) goto LAB_001387cd;
    iVar7 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar7 != 0) goto LAB_001387d2;
    iVar7 = std::__cxx11::string::compare((char *)psVar2);
    if (iVar7 != 0) goto LAB_001387d7;
    iVar7 = std::__cxx11::string::compare((char *)psVar3);
    if (iVar7 != 0) goto LAB_001387dc;
    iVar7 = std::__cxx11::string::compare((char *)psVar5);
    if (iVar7 != 0) goto LAB_001387e1;
    if (local_100.is_default == true) goto LAB_001387e6;
    if (local_100.has_validator_fn == true) goto LAB_001387eb;
    if ((undefined1 *)local_100.flag_ptr != &fLB::FLAGS_test_bool) goto LAB_001387f0;
    fLB::FLAGS_test_bool = 0;
    bVar6 = GetCommandLineFlagInfo("test_bool",&local_100);
    if (!bVar6) goto LAB_001387f5;
    iVar7 = std::__cxx11::string::compare((char *)&local_100);
    if (iVar7 != 0) goto LAB_001387fa;
    iVar7 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar7 != 0) goto LAB_001387ff;
    iVar7 = std::__cxx11::string::compare((char *)psVar2);
    if (iVar7 != 0) goto LAB_00138804;
    iVar7 = std::__cxx11::string::compare((char *)psVar3);
    if (iVar7 != 0) goto LAB_00138809;
    iVar7 = std::__cxx11::string::compare((char *)psVar5);
    if (iVar7 != 0) goto LAB_0013880e;
    if (local_100.is_default == true) goto LAB_00138813;
    if (local_100.has_validator_fn != true) {
      if ((undefined1 *)local_100.flag_ptr == &fLB::FLAGS_test_bool) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100.filename._M_dataplus._M_p != paVar4) {
          operator_delete(local_100.filename._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100.default_value._M_dataplus._M_p != &local_100.default_value.field_2) {
          operator_delete(local_100.default_value._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100.current_value._M_dataplus._M_p != &local_100.current_value.field_2) {
          operator_delete(local_100.current_value._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100.description._M_dataplus._M_p != &local_100.description.field_2) {
          operator_delete(local_100.description._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100.type._M_dataplus._M_p != &local_100.type.field_2) {
          operator_delete(local_100.type._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100.name._M_dataplus._M_p != &local_100.name.field_2) {
          operator_delete(local_100.name._M_dataplus._M_p);
        }
        FlagSaver::~FlagSaver(&FStack_108);
        return;
      }
      goto LAB_0013881d;
    }
  }
  else {
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagExists::Run();
LAB_001387a0:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagExists::Run();
LAB_001387a5:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagExists::Run();
LAB_001387aa:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagExists::Run();
LAB_001387af:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagExists::Run();
LAB_001387b4:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagExists::Run();
LAB_001387b9:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagExists::Run();
LAB_001387be:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagExists::Run();
LAB_001387c3:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagExists::Run();
LAB_001387c8:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagExists::Run();
LAB_001387cd:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagExists::Run();
LAB_001387d2:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagExists::Run();
LAB_001387d7:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagExists::Run();
LAB_001387dc:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagExists::Run();
LAB_001387e1:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagExists::Run();
LAB_001387e6:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagExists::Run();
LAB_001387eb:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagExists::Run();
LAB_001387f0:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagExists::Run();
LAB_001387f5:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagExists::Run();
LAB_001387fa:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagExists::Run();
LAB_001387ff:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagExists::Run();
LAB_00138804:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagExists::Run();
LAB_00138809:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagExists::Run();
LAB_0013880e:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagExists::Run();
LAB_00138813:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagExists::Run();
  }
  _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagExists::Run();
LAB_0013881d:
  _GLOBAL__N_1::Test_GetCommandLineFlagInfoTest_FlagExists::Run();
  CommandLineFlagInfo::~CommandLineFlagInfo(&local_100);
  FlagSaver::~FlagSaver(&FStack_108);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(GetCommandLineFlagInfoTest, FlagExists) {
  CommandLineFlagInfo info;
  bool r = GetCommandLineFlagInfo("test_int32", &info);
  EXPECT_TRUE(r);
  EXPECT_EQ("test_int32", info.name);
  EXPECT_EQ("int32", info.type);
  EXPECT_EQ("", info.description);
  EXPECT_EQ("-1", info.current_value);
  EXPECT_EQ("-1", info.default_value);
  EXPECT_TRUE(info.is_default);
  EXPECT_FALSE(info.has_validator_fn);
  EXPECT_EQ(&FLAGS_test_int32, info.flag_ptr);

  FLAGS_test_bool = true;
  r = GetCommandLineFlagInfo("test_bool", &info);
  EXPECT_TRUE(r);
  EXPECT_EQ("test_bool", info.name);
  EXPECT_EQ("bool", info.type);
  EXPECT_EQ("tests bool-ness", info.description);
  EXPECT_EQ("true", info.current_value);
  EXPECT_EQ("false", info.default_value);
  EXPECT_FALSE(info.is_default);
  EXPECT_FALSE(info.has_validator_fn);
  EXPECT_EQ(&FLAGS_test_bool, info.flag_ptr);

  FLAGS_test_bool = false;
  r = GetCommandLineFlagInfo("test_bool", &info);
  EXPECT_TRUE(r);
  EXPECT_EQ("test_bool", info.name);
  EXPECT_EQ("bool", info.type);
  EXPECT_EQ("tests bool-ness", info.description);
  EXPECT_EQ("false", info.current_value);
  EXPECT_EQ("false", info.default_value);
  EXPECT_FALSE(info.is_default);  // value is same, but flag *was* modified
  EXPECT_FALSE(info.has_validator_fn);
  EXPECT_EQ(&FLAGS_test_bool, info.flag_ptr);
}